

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O2

string * __thiscall leveldb::Slice::ToString_abi_cxx11_(string *__return_storage_ptr__,Slice *this)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = this->data_;
  sVar3 = this->size_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::_M_construct<char_const*>();
    return __return_storage_ptr__;
  }
  __stack_chk_fail(__return_storage_ptr__,pcVar2,pcVar2 + sVar3);
}

Assistant:

std::string ToString() const { return std::string(data_, size_); }